

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

_Bool modify_panel(term_conflict2 *t,wchar_t wy,wchar_t wx)

{
  _Bool _Var1;
  int iVar2;
  int local_38;
  wchar_t screen_wid;
  wchar_t screen_hgt;
  wchar_t dungeon_wid;
  wchar_t dungeon_hgt;
  wchar_t wx_local;
  wchar_t wy_local;
  term_conflict2 *t_local;
  
  if (t == (term_conflict2 *)angband_term[0]) {
    iVar2 = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode]) /
            (int)(uint)tile_height;
    local_38 = ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
  }
  else {
    iVar2 = t->hgt / (int)(uint)tile_height;
    local_38 = t->wid / (int)(uint)tile_width;
  }
  dungeon_hgt = wy;
  if (cave->height - iVar2 < wy) {
    dungeon_hgt = cave->height - iVar2;
  }
  if (dungeon_hgt < L'\0') {
    dungeon_hgt = L'\0';
  }
  dungeon_wid = wx;
  if (cave->width - local_38 < wx) {
    dungeon_wid = cave->width - local_38;
  }
  if (dungeon_wid < L'\0') {
    dungeon_wid = L'\0';
  }
  _Var1 = panel_should_modify(t,dungeon_hgt,dungeon_wid);
  if (_Var1) {
    t->offset_y = dungeon_hgt;
    t->offset_x = dungeon_wid;
    player->upkeep->redraw = player->upkeep->redraw | 0x10000;
  }
  return _Var1;
}

Assistant:

bool modify_panel(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* React to changes */
	if (panel_should_modify(t, wy, wx)) {
		/* Save wy, wx */
		t->offset_y = wy;
		t->offset_x = wx;

		/* Redraw map */
		player->upkeep->redraw |= (PR_MAP);

		/* Changed */
		return (true);
	}

	/* No change */
	return (false);
}